

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
BayesianGameBase::JointToIndividualTypeIndices(BayesianGameBase *this,Index jTypeI)

{
  iterator iVar1;
  mapped_type *pmVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  long lVar4;
  undefined4 in_register_00000034;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *this_00;
  long lVar5;
  uint local_34;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  local_34 = jTypeI;
  if (this[8] == (BayesianGameBase)0x1) {
    iVar1 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::find(*(_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                     **)(this + 0x68),&local_34);
    this_00 = *(map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                **)(this + 0x68);
    if (iVar1._M_node == (_Base_ptr)(this_00 + 8)) {
      IndexTools::JointToIndividualIndices((uint)&local_30,(vector *)(ulong)local_34);
      pmVar2 = std::
               map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](*(map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                              **)(this + 0x68),&local_34);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar2,&local_30);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
      this_00 = *(map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  **)(this + 0x68);
    }
    pvVar3 = std::
             map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](this_00,&local_34);
  }
  else {
    lVar5 = (ulong)jTypeI * 0x18;
    lVar4 = **(long **)(this + 0x60);
    if (*(long *)(lVar4 + 8 + lVar5) == *(long *)(lVar4 + lVar5)) {
      IndexTools::JointToIndividualIndices
                ((uint)&local_30,(vector *)CONCAT44(in_register_00000034,jTypeI));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 (**(long **)(this + 0x60) + lVar5),&local_30);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
      lVar4 = **(long **)(this + 0x60);
    }
    pvVar3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar4 + lVar5);
  }
  return pvVar3;
}

Assistant:

const std::vector<Index>& JointToIndividualTypeIndices(Index jTypeI) const
        {
            if(_m_useSparse)
            {
                if((*_m_jointToIndTypesMap).find(jTypeI)==
                   (*_m_jointToIndTypesMap).end())
                    (*_m_jointToIndTypesMap)[jTypeI]=
                        IndexTools::JointToIndividualIndices(
                            jTypeI, _m_nrTypes);
                return((*_m_jointToIndTypesMap)[jTypeI]);
                    
            }
            else
            {
                if((*_m_jointToIndTypes)[jTypeI].size()==0)
                    (*_m_jointToIndTypes)[jTypeI]=
                        IndexTools::JointToIndividualIndices(
                            jTypeI, _m_nrTypes);
                return((*_m_jointToIndTypes)[jTypeI]);
            }
        }